

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::Totals::delta(Totals *this,Totals *prevTotals)

{
  Totals *in_RDI;
  Totals *diff;
  
  operator-(this,prevTotals);
  if ((in_RDI->assertions).failed == 0) {
    if ((in_RDI->assertions).failedButOk == 0) {
      (in_RDI->testCases).passed = (in_RDI->testCases).passed + 1;
    }
    else {
      (in_RDI->testCases).failedButOk = (in_RDI->testCases).failedButOk + 1;
    }
  }
  else {
    (in_RDI->testCases).failed = (in_RDI->testCases).failed + 1;
  }
  return in_RDI;
}

Assistant:

Totals Totals::delta( Totals const& prevTotals ) const {
        Totals diff = *this - prevTotals;
        if( diff.assertions.failed > 0 )
            ++diff.testCases.failed;
        else if( diff.assertions.failedButOk > 0 )
            ++diff.testCases.failedButOk;
        else
            ++diff.testCases.passed;
        return diff;
    }